

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O2

void __thiscall
Js::WebAssemblyEnvironment::SetGlobalValue
          (WebAssemblyEnvironment *this,WasmGlobal *global,WasmConstLitNode cnst)

{
  code *pcVar1;
  bool bVar2;
  uint offset;
  undefined4 *puVar3;
  
  if (global == (WasmGlobal *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0xae,"(global)","global");
    if (!bVar2) goto LAB_00c17996;
    *puVar3 = 0;
  }
  offset = WebAssemblyModule::GetOffsetForGlobal((this->module).ptr,global);
  switch(global->m_type) {
  case FirstLocalType:
    SetGlobalInternal<int>(this,offset,(int)cnst.field_0.f32);
    return;
  case I64:
    SetGlobalInternal<long>(this,offset,(long)cnst.field_0.f64);
    return;
  case F32:
    SetGlobalInternal<float>(this,offset,cnst.field_0.f32);
    return;
  case F64:
    SetGlobalInternal<double>(this,offset,cnst.field_0.f64);
    return;
  case V128:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0xb8,"((0))","Wasm.Simd globals not supported");
    if (!bVar2) {
LAB_00c17996:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Wasm::WasmTypes::
  CompileAssertCases<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
            ();
}

Assistant:

void WebAssemblyEnvironment::SetGlobalValue(Wasm::WasmGlobal* global, Wasm::WasmConstLitNode cnst)
{
    AssertOrFailFast(global);
    uint32 offset = module->GetOffsetForGlobal(global);

    switch (global->GetType())
    {
    case Wasm::WasmTypes::I32: SetGlobalInternal<int>(offset, cnst.i32); break;
    case Wasm::WasmTypes::I64: SetGlobalInternal<int64>(offset, cnst.i64); break;
    case Wasm::WasmTypes::F32: SetGlobalInternal<float>(offset, cnst.f32); break;
    case Wasm::WasmTypes::F64: SetGlobalInternal<double>(offset, cnst.f64); break;
#ifdef ENABLE_WASM_SIMD
    case Wasm::WasmTypes::V128: AssertOrFailFastMsg(UNREACHED, "Wasm.Simd globals not supported");
#endif
    default:
        Wasm::WasmTypes::CompileAssertCases<Wasm::WasmTypes::I32, Wasm::WasmTypes::I64, Wasm::WasmTypes::F32, Wasm::WasmTypes::F64, WASM_V128_CHECK_TYPE>();
    }
}